

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

void __thiscall Imf_2_5::Image::shiftPixels(Image *this,int dx,int dy)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  pointer ppVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  long lVar7;
  long lVar8;
  ImageLevel **ppIVar9;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int x;
  int y;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>_>
  *in_stack_fffffffffffffc18;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
  *in_stack_fffffffffffffc20;
  int local_348;
  int local_344;
  stringstream local_340 [16];
  ostream local_330 [392];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  _Self local_20;
  _Self local_18;
  uint local_10;
  uint local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>_>
       ::begin(in_stack_fffffffffffffc18);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>_>
         ::end(in_stack_fffffffffffffc18);
    bVar3 = std::operator!=(&local_18,&local_20);
    uVar2 = local_c;
    if (!bVar3) {
      *(uint *)(in_RDI + 8) = local_c + *(int *)(in_RDI + 8);
      *(uint *)(in_RDI + 0xc) = local_10 + *(int *)(in_RDI + 0xc);
      *(uint *)(in_RDI + 0x10) = local_c + *(int *)(in_RDI + 0x10);
      *(uint *)(in_RDI + 0x14) = local_10 + *(int *)(in_RDI + 0x14);
      local_344 = 0;
      while( true ) {
        lVar7 = Array2D<Imf_2_5::ImageLevel_*>::height
                          ((Array2D<Imf_2_5::ImageLevel_*> *)(in_RDI + 0x50));
        if (lVar7 <= local_344) break;
        local_348 = 0;
        while( true ) {
          lVar7 = (long)local_348;
          lVar8 = Array2D<Imf_2_5::ImageLevel_*>::width
                            ((Array2D<Imf_2_5::ImageLevel_*> *)(in_RDI + 0x50));
          if (lVar8 <= lVar7) break;
          ppIVar9 = Array2D<Imf_2_5::ImageLevel_*>::operator[]
                              ((Array2D<Imf_2_5::ImageLevel_*> *)(in_RDI + 0x50),(long)local_344);
          if (ppIVar9[local_348] != (ImageLevel *)0x0) {
            ppIVar9 = Array2D<Imf_2_5::ImageLevel_*>::operator[]
                                ((Array2D<Imf_2_5::ImageLevel_*> *)(in_RDI + 0x50),(long)local_344);
            (*ppIVar9[local_348]->_vptr_ImageLevel[3])
                      (ppIVar9[local_348],(ulong)local_c,(ulong)local_10);
          }
          local_348 = local_348 + 1;
        }
        local_344 = local_344 + 1;
      }
      return;
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
                           *)0x12e070);
    uVar1 = local_10;
    if ((int)uVar2 % (ppVar4->second).xSampling != 0) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
                           *)0x12e1d9);
    if ((int)uVar1 % (ppVar4->second).ySampling != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_340);
      poVar5 = std::operator<<(local_330,"Cannot shift image vertically by ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_10);
      poVar5 = std::operator<<(poVar5,
                               " pixels.  The shift distance must be a multiple of the y sampling rate of all channels, but the y sampling rate channel "
                              );
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
                             *)0x12e259);
      poVar5 = std::operator<<(poVar5,(string *)ppVar4);
      poVar5 = std::operator<<(poVar5," is ");
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
                             *)0x12e292);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar4->second).ySampling);
      std::operator<<(poVar5,".");
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar6,local_340);
      __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
    ::operator++(in_stack_fffffffffffffc20);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar5 = std::operator<<(local_198,"Cannot shift image horizontally by ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_c);
  poVar5 = std::operator<<(poVar5,
                           " pixels.  The shift distance must be a multiple of the x sampling rate of all channels, but the x sampling rate channel "
                          );
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
                         *)0x12e0ff);
  poVar5 = std::operator<<(poVar5,(string *)ppVar4);
  poVar5 = std::operator<<(poVar5," is ");
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>
                         *)0x12e138);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ppVar4->second).xSampling);
  std::operator<<(poVar5,".");
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar6,local_1a8);
  __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
Image::shiftPixels (int dx, int dy)
{
    for (ChannelMap::iterator i = _channels.begin(); i != _channels.end(); ++i)
    {
        if (dx % i->second.xSampling != 0)
        {
            THROW (ArgExc, "Cannot shift image horizontally by " << dx << " "
                           "pixels.  The shift distance must be a multiple "
                           "of the x sampling rate of all channels, but the "
                           "x sampling rate channel " << i->first << " "
                           "is " << i->second.xSampling << ".");
        }

        if (dy % i->second.ySampling != 0)
        {
            THROW (ArgExc, "Cannot shift image vertically by " << dy << " "
                           "pixels.  The shift distance must be a multiple "
                           "of the y sampling rate of all channels, but the "
                           "y sampling rate channel " << i->first << " "
                           "is " << i->second.ySampling << ".");
        }
    }

    _dataWindow.min.x += dx;
    _dataWindow.min.y += dy;
    _dataWindow.max.x += dx;
    _dataWindow.max.y += dy;

    for (int y = 0; y < _levels.height(); ++y)
        for (int x = 0; x < _levels.width(); ++x)
            if (_levels[y][x])
                _levels[y][x]->shiftPixels (dx, dy);
}